

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapTest.cpp
# Opt level: O1

void print<ft::map<int,int,ft::less<int>,ft::allocator<ft::pair<int_const,int>>>>
               (map<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *t,char *s)

{
  treeNode<ft::pair<const_int,_int>_> *ptVar1;
  long lVar2;
  treeNode<ft::pair<const_int,_int>_> *ptVar3;
  undefined8 in_RAX;
  size_t sVar4;
  ostream *poVar5;
  treeNode<ft::pair<const_int,_int>_> *ptVar6;
  treeNode<ft::pair<const_int,_int>_> *ptVar7;
  bool bVar8;
  undefined8 uStack_38;
  
  lVar2 = std::cout;
  *(undefined8 *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) = 3;
  uStack_38 = in_RAX;
  if (s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(lVar2 + -0x18) + 0x1150d0);
  }
  else {
    sVar4 = strlen(s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,s,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," contains:",10);
  ptVar6 = ((t->super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>).
            super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
            .m_tree.m_first)->parent;
  if (ptVar6 != (t->
                super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>).
                super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                .m_tree.m_last) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (",2);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(ptVar6->value).first);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," => ",4);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(ptVar6->value).second);
      uStack_38 = CONCAT17(0x29,(undefined7)uStack_38);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)((long)&uStack_38 + 7),1);
      ptVar1 = (t->super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
               ).
               super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
               .m_tree.NIL;
      ptVar3 = ptVar6->right;
      ptVar7 = ptVar6;
      if (ptVar6->right == ptVar1) {
        do {
          ptVar6 = ptVar7->parent;
          bVar8 = ptVar6->right == ptVar7;
          ptVar7 = ptVar6;
        } while (bVar8);
      }
      else {
        do {
          ptVar6 = ptVar3;
          ptVar3 = ptVar6->left;
        } while (ptVar6->left != ptVar1);
      }
    } while (ptVar6 != (t->
                       super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                       ).
                       super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                       .m_tree.m_last);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  return;
}

Assistant:

void	print(T const & t, char const * s)
{
	typename T::const_iterator	it;

	std::cout << std::setw(3) << s << " contains:";
	for (it = t.begin(); it != t.end(); ++it)
		std::cout << " (" << it->first << " => " << it->second << ')';
	std::cout << std::endl;
}